

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::RecursiveMessage::_InternalSerialize
          (RecursiveMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  RecursiveMessage *value;
  string_view s;
  bool bVar2;
  int iVar3;
  uint32_t *puVar4;
  string *this_00;
  void *data;
  string *_s;
  uint32_t cached_has_bits;
  RecursiveMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  RecursiveMessage *this_local;
  
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 2) != 0) {
    value = (this->field_0)._impl_.recurse_;
    iVar3 = GetCachedSize((this->field_0)._impl_.recurse_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,&value->super_MessageLite,iVar3,target,stream);
  }
  if ((uVar1 & 1) != 0) {
    this_00 = _internal_payload_abi_cxx11_(this);
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteBytesMaybeAliased
                             (stream,2,s,(uint8_t *)stream_local);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar3 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar3,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL RecursiveMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const RecursiveMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.RecursiveMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.RecursiveMessage recurse = 1;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.recurse_, this_._impl_.recurse_->GetCachedSize(), target,
        stream);
  }

  // bytes payload = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_payload();
    target = stream->WriteBytesMaybeAliased(2, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.RecursiveMessage)
  return target;
}